

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldIndex_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  int iVar1;
  Type TVar2;
  int iVar3;
  uint uVar4;
  Descriptor *this_00;
  Descriptor *this_01;
  FieldDescriptor *pFVar5;
  Descriptor *pDVar6;
  int i_00;
  int i_01;
  int local_2c;
  int i;
  Descriptor *parent_type;
  Descriptor *containing_type;
  FieldDescriptor *field_local;
  
  this_00 = FieldDescriptor::containing_type((FieldDescriptor *)this);
  this_01 = Descriptor::containing_type(this_00);
  if (this_01 != (Descriptor *)0x0) {
    for (local_2c = 0; iVar1 = Descriptor::field_count(this_01), local_2c < iVar1;
        local_2c = local_2c + 1) {
      pFVar5 = Descriptor::field(this_01,local_2c);
      TVar2 = FieldDescriptor::type(pFVar5);
      if (TVar2 == TYPE_GROUP) {
        pFVar5 = Descriptor::field(this_01,local_2c);
        pDVar6 = FieldDescriptor::message_type(pFVar5);
        if (pDVar6 == this_00) {
          iVar1 = FieldDescriptor::number((FieldDescriptor *)this);
          pFVar5 = Descriptor::field(this_01,local_2c);
          iVar3 = FieldDescriptor::number(pFVar5);
          SimpleItoa_abi_cxx11_
                    (__return_storage_ptr__,(protobuf *)(ulong)(uint)(iVar1 - iVar3),i_00);
          return __return_storage_ptr__;
        }
      }
    }
  }
  uVar4 = FieldDescriptor::number((FieldDescriptor *)this);
  SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar4,i_01);
  return __return_storage_ptr__;
}

Assistant:

string JSFieldIndex(const FieldDescriptor* field) {
  // Determine whether this field is a member of a group. Group fields are a bit
  // wonky: their "containing type" is a message type created just for the
  // group, and that type's parent type has a field with the group-message type
  // as its message type and TYPE_GROUP as its field type. For such fields, the
  // index we use is relative to the field number of the group submessage field.
  // For all other fields, we just use the field number.
  const Descriptor* containing_type = field->containing_type();
  const Descriptor* parent_type = containing_type->containing_type();
  if (parent_type != NULL) {
    for (int i = 0; i < parent_type->field_count(); i++) {
      if (parent_type->field(i)->type() == FieldDescriptor::TYPE_GROUP &&
          parent_type->field(i)->message_type() == containing_type) {
        return SimpleItoa(field->number() - parent_type->field(i)->number());
      }
    }
  }
  return SimpleItoa(field->number());
}